

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string_t __thiscall
duckdb::StringVector::AddStringOrBlob(StringVector *this,Vector *vector,string_t data)

{
  VectorStringBuffer *this_00;
  string_t sVar1;
  string_t sVar2;
  
  sVar1.value._8_8_ = data.value._0_8_;
  if (0xc < (uint)vector) {
    this_00 = GetStringBuffer((Vector *)this);
    sVar1.value._0_8_ = vector;
    sVar1 = VectorStringBuffer::AddBlob(this_00,sVar1);
    vector = sVar1.value._0_8_;
  }
  sVar2.value.pointer.ptr = (char *)sVar1.value._8_8_;
  sVar2.value._0_8_ = vector;
  return (string_t)sVar2.value;
}

Assistant:

string_t StringVector::AddStringOrBlob(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	auto &string_buffer = GetStringBuffer(vector);
	return string_buffer.AddBlob(data);
}